

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InlineOpaquePass::HasOpaqueArgsOrReturn(InlineOpaquePass *this,Instruction *callInst)

{
  pointer pOVar1;
  uint **ppuVar2;
  bool bVar3;
  char cVar4;
  uint32_t typeId;
  uint **ppuVar5;
  pointer pOVar6;
  bool bVar7;
  int icnt;
  undefined4 *local_58;
  InlineOpaquePass *pIStack_50;
  code *local_48;
  code *pcStack_40;
  uint *local_38;
  undefined4 local_2c;
  
  typeId = 0;
  if (callInst->has_type_id_ == true) {
    typeId = Instruction::GetSingleWordOperand(callInst,0);
  }
  bVar3 = IsOpaqueType(this,typeId);
  bVar7 = true;
  if (!bVar3) {
    local_58 = &local_2c;
    local_2c = 0;
    pcStack_40 = std::
                 _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:54:35)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:54:35)>
               ::_M_manager;
    pOVar6 = (callInst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pOVar1 = (callInst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar7 = pOVar6 == pOVar1;
    pIStack_50 = this;
    if (!bVar7) {
      bVar7 = false;
      do {
        bVar3 = spvIsInIdType(pOVar6->type);
        if (bVar3) {
          ppuVar2 = (uint **)(pOVar6->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar5 = &(pOVar6->words).small_data_;
          if (ppuVar2 != (uint **)0x0) {
            ppuVar5 = ppuVar2;
          }
          local_38 = *ppuVar5;
          if (local_48 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          cVar4 = (*pcStack_40)(&local_58,&local_38);
          if (cVar4 == '\0') break;
        }
        pOVar6 = pOVar6 + 1;
        bVar7 = pOVar6 == pOVar1;
      } while (!bVar7);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    bVar7 = (bool)(bVar7 ^ 1);
  }
  return bVar7;
}

Assistant:

bool InlineOpaquePass::HasOpaqueArgsOrReturn(const Instruction* callInst) {
  // Check return type
  if (IsOpaqueType(callInst->type_id())) return true;
  // Check args
  int icnt = 0;
  return !callInst->WhileEachInId([&icnt, this](const uint32_t* iid) {
    if (icnt > 0) {
      const Instruction* argInst = get_def_use_mgr()->GetDef(*iid);
      if (IsOpaqueType(argInst->type_id())) return false;
    }
    ++icnt;
    return true;
  });
}